

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saxman.h
# Opt level: O3

void ClownLZSS::Internal::Saxman::Decompress<std::ifstream,std::ofstream&>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char>_&> *output,uint compressed_length)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint count;
  ulong uVar7;
  int iVar8;
  
  lVar5 = std::istream::tellg();
  iVar2 = std::ostream::tellp();
  bVar1 = std::istream::get();
  lVar6 = std::istream::tellg();
  if (lVar6 - lVar5 < (long)(ulong)compressed_length) {
    uVar7 = (ulong)bVar1;
    iVar8 = 8;
    do {
      if (iVar8 == 0) {
        bVar1 = std::istream::get();
        uVar7 = (ulong)bVar1;
        iVar8 = 8;
      }
      bVar1 = std::istream::get();
      if ((uVar7 & 1) == 0) {
        uVar3 = std::istream::get();
        count = (uVar3 & 0xf) + 3;
        iVar4 = std::ostream::tellp();
        uVar3 = ((iVar4 - iVar2) - ((uVar3 & 0xf0) << 4 | (uint)bVar1)) + 0xfee & 0xfff;
        if ((uint)(iVar4 - iVar2) < uVar3) {
          do {
            DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>
            ::WriteImplementation(output,'\0');
            count = count - 1;
          } while (count != 0);
        }
        else {
          DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>::
          Copy(output,uVar3,count);
        }
      }
      else {
        DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>::
        WriteImplementation(output,bVar1);
      }
      uVar7 = uVar7 >> 1;
      iVar8 = iVar8 + -1;
      lVar6 = std::istream::tellg();
    } while (lVar6 - lVar5 < (long)(ulong)compressed_length);
  }
  return;
}

Assistant:

void Decompress(DecompressorInput<T1> &input, DecompressorOutput<T2> &output, const unsigned int compressed_length)
			{
				const auto input_start_position = input.Tell();
				const auto output_start_position = output.Tell();

				BitField<decltype(input)> descriptor_bits(input);

				while (input.Distance(input_start_position) < compressed_length)
				{
					if (descriptor_bits.Pop())
					{
						// Uncompressed.
						output.Write(input.Read());
					}
					else
					{
						// Dictionary match.
						const unsigned int first_byte = input.Read();
						const unsigned int second_byte = input.Read();
						const unsigned int dictionary_index = (first_byte | ((second_byte << 4) & 0xF00)) + (0xF + 3);
						const unsigned int count = (second_byte & 0xF) + 3;
						const unsigned int output_position = output.Distance(output_start_position);
						const unsigned int distance = (output_position - dictionary_index) % 0x1000;

						if (distance > output_position)
						{
							// Zero-fill.
							output.Fill(0, count);
						}
						else
						{
							// Copy.
							output.Copy(distance, count);
						}
					}
				}
			}